

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

void __thiscall
mjs::anon_unknown_46::json_lexer::throw_unexpected(json_lexer *this,json_token *token)

{
  wostream *pwVar1;
  native_error_exception *this_00;
  global_object *this_01;
  wstring *pwVar2;
  wostringstream *this_02;
  wstring_view *s;
  char *pcVar3;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  pointer local_1c0;
  wstring_view local_1a8;
  wostringstream woss;
  
  this_02 = (wostringstream *)&woss;
  std::__cxx11::wostringstream::wostringstream(this_02);
  std::operator<<((wostream *)this_02,"Unexpected ");
  if (token->type_ == eof) {
    pcVar3 = "end of input";
    goto LAB_0013e120;
  }
  pwVar1 = std::operator<<((wostream *)&woss,"token ");
  switch(token->type_) {
  case whitespace:
    pcVar3 = "whitespace";
    break;
  case string:
    pwVar1 = std::operator<<(pwVar1,'\"');
    pwVar2 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)token);
    local_1c0 = (pwVar2->_M_dataplus)._M_p;
    local_1c8 = (wchar_t *)pwVar2->_M_string_length;
    cpp_quote_abi_cxx11_(&local_1f8,(mjs *)&local_1c8,s);
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_1f8);
    this_02 = (wostringstream *)std::operator<<(pwVar1,'\"');
    std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
    goto LAB_0013e301;
  case number:
    pwVar2 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)token);
    this_02 = (wostringstream *)std::operator<<(pwVar1,(wstring *)pwVar2);
    goto LAB_0013e301;
  case null:
    pcVar3 = "null";
    break;
  case false_:
    pcVar3 = "false";
    break;
  case true_:
    pcVar3 = "true";
    break;
  case lbracket:
    pcVar3 = "lbracket";
    break;
  case rbracket:
    pcVar3 = "rbracket";
    break;
  case lbrace:
    pcVar3 = "lbrace";
    break;
  case rbrace:
    pcVar3 = "rbrace";
    break;
  case comma:
    pcVar3 = "comma";
    break;
  case colon:
    pcVar3 = "colon";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                  ,0x32,
                  "std::wostream &mjs::(anonymous namespace)::operator<<(std::wostream &, json_token_type)"
                 );
  }
  this_02 = (wostringstream *)std::operator<<(pwVar1,pcVar3);
LAB_0013e301:
  pcVar3 = " in JSON";
LAB_0013e120:
  std::operator<<((wostream *)this_02,pcVar3);
  pwVar1 = std::operator<<((wostream *)&woss," at position ");
  std::wostream::_M_insert<unsigned_long>((ulong)pwVar1);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  global_object::stack_trace_abi_cxx11_(&local_1f8,this_01);
  local_1d8._M_len = local_1f8._M_string_length;
  local_1d8._M_str = local_1f8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = (size_t)local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_00,syntax,&local_1d8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

[[noreturn]] void throw_unexpected(const json_token& token) {
        std::wostringstream woss;
        woss << "Unexpected ";
        if (token.type() == json_token_type::eof) {
            woss << "end of input";
        } else {
            woss << "token " << token << " in JSON";
        }
        woss << " at position " << token.pos();
        throw native_error_exception{native_error_type::syntax, global()->stack_trace(), woss.str()};
    }